

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperationSingleQueueTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::synchronization::anon_unknown_2::EventTestInstance::iterate
          (TestStatus *__return_storage_ptr__,EventTestInstance *this)

{
  VkImageSubresourceRange *pVVar1;
  Operation *pOVar2;
  ulong uVar3;
  bool bVar4;
  deUint32 queueFamilyIndex;
  uint uVar5;
  int iVar6;
  DeviceInterface *vk;
  VkDevice device;
  VkAccessFlags srcAccessMask;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_EDX;
  VkImageLayout extraout_EDX_00;
  void *__s1;
  void *__s2;
  Resource *pRVar7;
  TestStatus *__return_storage_ptr___00;
  allocator<char> local_131;
  VkDevice local_130;
  TestStatus *local_128;
  VkImageLayout local_11c;
  RefBase<vk::VkCommandBuffer_s_*> local_118;
  ulong local_f8;
  VkQueue local_f0;
  VkBufferMemoryBarrier barrier;
  RefBase<vk::Handle<(vk::HandleType)10>_> local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  deUint32 local_68;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_58;
  
  vk = Context::getDeviceInterface((this->super_BaseTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_BaseTestInstance).super_TestInstance.m_context);
  local_f0 = Context::getUniversalQueue((this->super_BaseTestInstance).super_TestInstance.m_context)
  ;
  queueFamilyIndex =
       Context::getUniversalQueueFamilyIndex
                 ((this->super_BaseTestInstance).super_TestInstance.m_context);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&barrier,vk,device,2,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  local_58.m_data.deleter.m_device = (VkDevice)barrier._16_8_;
  local_58.m_data.deleter.m_allocator = (VkAllocationCallbacks *)barrier._24_8_;
  local_58.m_data.object.m_internal = barrier._0_8_;
  local_58.m_data.deleter.m_deviceIface = (DeviceInterface *)barrier.pNext;
  barrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  barrier._4_4_ = 0;
  barrier.pNext = (void *)0x0;
  barrier.srcAccessMask = 0;
  barrier.dstAccessMask = 0;
  barrier.srcQueueFamilyIndex = 0;
  barrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&barrier);
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&barrier,vk,device,
                    (VkCommandPool)local_58.m_data.object.m_internal);
  local_118.m_data.deleter.m_device = (VkDevice)barrier._16_8_;
  local_118.m_data.deleter.m_pool.m_internal._0_4_ = barrier.srcQueueFamilyIndex;
  local_118.m_data.deleter.m_pool.m_internal._4_4_ = barrier.dstQueueFamilyIndex;
  local_118.m_data.object = (VkCommandBuffer_s *)barrier._0_8_;
  local_118.m_data.deleter.m_deviceIface = (DeviceInterface *)barrier.pNext;
  barrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  barrier._4_4_ = 0;
  barrier.pNext = (void *)0x0;
  barrier.srcAccessMask = 0;
  barrier.dstAccessMask = 0;
  barrier.srcQueueFamilyIndex = 0;
  barrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&barrier);
  ::vk::createEvent((Move<vk::Handle<(vk::HandleType)10>_> *)&barrier,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  local_98.m_data.deleter.m_device = (VkDevice)barrier._16_8_;
  local_98.m_data.deleter.m_allocator = (VkAllocationCallbacks *)barrier._24_8_;
  local_98.m_data.object.m_internal = barrier._0_8_;
  local_98.m_data.deleter.m_deviceIface = (DeviceInterface *)barrier.pNext;
  barrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  barrier._4_4_ = 0;
  barrier.pNext = (void *)0x0;
  barrier.srcAccessMask = 0;
  barrier.dstAccessMask = 0;
  barrier.srcQueueFamilyIndex = 0;
  barrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)10>_> *)&barrier);
  uVar5 = (*((this->super_BaseTestInstance).m_writeOp.
             super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
             .m_data.ptr)->_vptr_Operation[3])();
  local_130 = (VkDevice)CONCAT44(local_130._4_4_,extraout_EDX);
  iVar6 = (*((this->super_BaseTestInstance).m_readOp.
             super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
             .m_data.ptr)->_vptr_Operation[3])();
  local_f8 = CONCAT44(extraout_var,iVar6);
  local_11c = extraout_EDX_00;
  beginCommandBuffer(vk,local_118.m_data.object);
  pOVar2 = (this->super_BaseTestInstance).m_writeOp.
           super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           .m_data.ptr;
  (*pOVar2->_vptr_Operation[2])(pOVar2,local_118.m_data.object);
  (*vk->_vptr_DeviceInterface[0x6a])
            (vk,local_118.m_data.object,local_98.m_data.object.m_internal,(ulong)uVar5);
  pRVar7 = (this->super_BaseTestInstance).m_resource.
           super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
           .m_data.ptr;
  if (pRVar7->m_type != RESOURCE_TYPE_BUFFER) {
    bVar4 = isIndirectBuffer(pRVar7->m_type);
    uVar3 = local_f8;
    pRVar7 = (this->super_BaseTestInstance).m_resource.
             super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
             .m_data.ptr;
    if (!bVar4) {
      __return_storage_ptr___00 = __return_storage_ptr__;
      if (pRVar7->m_type == RESOURCE_TYPE_IMAGE) {
        local_68 = (pRVar7->m_imageData).subresourceRange.layerCount;
        pVVar1 = &(pRVar7->m_imageData).subresourceRange;
        local_78._0_4_ = pVVar1->aspectMask;
        local_78._4_4_ = pVVar1->baseMipLevel;
        uStack_70._0_4_ = (pRVar7->m_imageData).subresourceRange.levelCount;
        uStack_70._4_4_ = (pRVar7->m_imageData).subresourceRange.baseArrayLayer;
        local_128 = __return_storage_ptr__;
        makeImageMemoryBarrier
                  ((VkImageMemoryBarrier *)&barrier,srcAccessMask,(VkAccessFlags)(local_f8 >> 0x20),
                   (VkImageLayout)local_130,local_11c,
                   (VkImage)(pRVar7->m_imageData).handle.m_internal,*pVVar1);
        (*vk->_vptr_DeviceInterface[0x6c])
                  (vk,local_118.m_data.object,1,&local_98,(ulong)uVar5,uVar3 & 0xffffffff,0,0,0,0,1,
                   &barrier);
        __return_storage_ptr___00 = local_128;
      }
      goto LAB_00755228;
    }
  }
  uVar3 = local_f8;
  local_130 = device;
  local_128 = __return_storage_ptr__;
  makeBufferMemoryBarrier
            (&barrier,srcAccessMask,(VkAccessFlags)(local_f8 >> 0x20),
             (VkBuffer)(pRVar7->m_bufferData).handle.m_internal,(pRVar7->m_bufferData).offset,
             (pRVar7->m_bufferData).size);
  (*vk->_vptr_DeviceInterface[0x6c])
            (vk,local_118.m_data.object,1,&local_98,(ulong)uVar5,uVar3 & 0xffffffff,0,0,1,&barrier,0
             ,0);
  device = local_130;
  __return_storage_ptr___00 = local_128;
LAB_00755228:
  pOVar2 = (this->super_BaseTestInstance).m_readOp.
           super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           .m_data.ptr;
  (*pOVar2->_vptr_Operation[2])(pOVar2,local_118.m_data.object);
  endCommandBuffer(vk,local_118.m_data.object);
  submitCommandsAndWait(vk,device,local_f0,local_118.m_data.object);
  iVar6 = (*((this->super_BaseTestInstance).m_writeOp.
             super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
             .m_data.ptr)->_vptr_Operation[4])();
  (*((this->super_BaseTestInstance).m_readOp.
     super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
     .m_data.ptr)->_vptr_Operation[4])();
  iVar6 = bcmp(__s1,__s2,CONCAT44(extraout_var_00,iVar6));
  if (iVar6 == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&barrier,"OK",&local_131);
    tcu::TestStatus::pass(__return_storage_ptr___00,(string *)&barrier);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&barrier,"Memory contents don\'t match",&local_131);
    tcu::TestStatus::fail(__return_storage_ptr___00,(string *)&barrier);
  }
  std::__cxx11::string::~string((string *)&barrier);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::~RefBase(&local_98);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_118);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_58);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const DeviceInterface&			vk					= m_context.getDeviceInterface();
		const VkDevice					device				= m_context.getDevice();
		const VkQueue					queue				= m_context.getUniversalQueue();
		const deUint32					queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
		const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
		const Unique<VkCommandBuffer>	cmdBuffer			(makeCommandBuffer(vk, device, *cmdPool));
		const Unique<VkEvent>			event				(createEvent(vk, device));
		const SyncInfo					writeSync			= m_writeOp->getSyncInfo();
		const SyncInfo					readSync			= m_readOp->getSyncInfo();

		beginCommandBuffer(vk, *cmdBuffer);

		m_writeOp->recordCommands(*cmdBuffer);
		vk.cmdSetEvent(*cmdBuffer, *event, writeSync.stageMask);

		if (m_resource->getType() == RESOURCE_TYPE_BUFFER || isIndirectBuffer(m_resource->getType()))
		{
			const VkBufferMemoryBarrier barrier = makeBufferMemoryBarrier(writeSync.accessMask, readSync.accessMask,
				m_resource->getBuffer().handle, m_resource->getBuffer().offset, m_resource->getBuffer().size);
			vk.cmdWaitEvents(*cmdBuffer, 1u, &event.get(), writeSync.stageMask, readSync.stageMask, 0u, DE_NULL, 1u, &barrier, 0u, DE_NULL);
		}
		else if (m_resource->getType() == RESOURCE_TYPE_IMAGE)
		{
			const VkImageMemoryBarrier barrier =  makeImageMemoryBarrier(writeSync.accessMask, readSync.accessMask,
				writeSync.imageLayout, readSync.imageLayout, m_resource->getImage().handle, m_resource->getImage().subresourceRange);
			vk.cmdWaitEvents(*cmdBuffer, 1u, &event.get(), writeSync.stageMask, readSync.stageMask, 0u, DE_NULL, 0u, DE_NULL, 1u, &barrier);
		}

		m_readOp->recordCommands(*cmdBuffer);

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);

		{
			const Data	expected = m_writeOp->getData();
			const Data	actual	 = m_readOp->getData();

			if (0 != deMemCmp(expected.data, actual.data, expected.size))
				return tcu::TestStatus::fail("Memory contents don't match");
		}

		return tcu::TestStatus::pass("OK");
	}